

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

CPAccessResult access_predinv(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  int iVar1;
  uint64_t uVar2;
  
  iVar1 = arm_current_el(env);
  if (iVar1 == 1) {
    uVar2 = arm_hcr_el2_eff_aarch64(env);
    if ((uVar2 >> 0x2a & 1) != 0) {
      return CP_ACCESS_TRAP_EL2;
    }
  }
  else if ((iVar1 == 0) && (uVar2 = arm_sctlr_aarch64(env,0), ((uint)uVar2 >> 10 & 1) == 0)) {
    return CP_ACCESS_TRAP;
  }
  return CP_ACCESS_OK;
}

Assistant:

static CPAccessResult access_predinv(CPUARMState *env, const ARMCPRegInfo *ri,
                                     bool isread)
{
    int el = arm_current_el(env);

    if (el == 0) {
        uint64_t sctlr = arm_sctlr(env, el);
        if (!(sctlr & SCTLR_EnRCTX)) {
            return CP_ACCESS_TRAP;
        }
    } else if (el == 1) {
        uint64_t hcr = arm_hcr_el2_eff(env);
        if (hcr & HCR_NV) {
            return CP_ACCESS_TRAP_EL2;
        }
    }
    return CP_ACCESS_OK;
}